

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::ContentEncoding::Write(ContentEncoding *this,IMkvWriter *writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint64_t encryption_size;
  uint64_t value;
  uint64 uVar4;
  int extraout_var;
  int extraout_var_00;
  
  encryption_size = EncryptionSize(this);
  value = EncodingSize(this,0,encryption_size);
  uVar4 = EbmlMasterElementSize(0x6240,value);
  iVar2 = (*writer->_vptr_IMkvWriter[1])(writer);
  if ((((((-1 < extraout_var) && (bVar1 = WriteEbmlMasterElement(writer,0x6240,value), bVar1)) &&
        (bVar1 = WriteEbmlElement(writer,0x5031,this->encoding_order_), bVar1)) &&
       ((bVar1 = WriteEbmlElement(writer,0x5032,this->encoding_scope_), bVar1 &&
        (bVar1 = WriteEbmlElement(writer,0x5033,this->encoding_type_), bVar1)))) &&
      ((bVar1 = WriteEbmlMasterElement(writer,0x5035,encryption_size), bVar1 &&
       ((bVar1 = WriteEbmlElement(writer,0x47e1,this->enc_algo_), bVar1 &&
        (bVar1 = WriteEbmlElement(writer,0x47e2,this->enc_key_id_,this->enc_key_id_length_), bVar1))
       )))) && (bVar1 = ContentEncAESSettings::Write(&this->enc_aes_settings_,writer), bVar1)) {
    iVar3 = (*writer->_vptr_IMkvWriter[1])(writer);
    return CONCAT44(extraout_var_00,iVar3) - CONCAT44(extraout_var,iVar2) == uVar4 + value &&
           -1 < extraout_var_00;
  }
  return false;
}

Assistant:

bool ContentEncoding::Write(IMkvWriter* writer) const {
  const uint64_t encryption_size = EncryptionSize();
  const uint64_t encoding_size = EncodingSize(0, encryption_size);
  const uint64_t size =
      EbmlMasterElementSize(libwebm::kMkvContentEncoding, encoding_size) +
      encoding_size;

  const int64_t payload_position = writer->Position();
  if (payload_position < 0)
    return false;

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvContentEncoding,
                              encoding_size))
    return false;
  if (!WriteEbmlElement(writer, libwebm::kMkvContentEncodingOrder,
                        static_cast<uint64>(encoding_order_)))
    return false;
  if (!WriteEbmlElement(writer, libwebm::kMkvContentEncodingScope,
                        static_cast<uint64>(encoding_scope_)))
    return false;
  if (!WriteEbmlElement(writer, libwebm::kMkvContentEncodingType,
                        static_cast<uint64>(encoding_type_)))
    return false;

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvContentEncryption,
                              encryption_size))
    return false;
  if (!WriteEbmlElement(writer, libwebm::kMkvContentEncAlgo,
                        static_cast<uint64>(enc_algo_))) {
    return false;
  }
  if (!WriteEbmlElement(writer, libwebm::kMkvContentEncKeyID, enc_key_id_,
                        enc_key_id_length_))
    return false;

  if (!enc_aes_settings_.Write(writer))
    return false;

  const int64_t stop_position = writer->Position();
  if (stop_position < 0 ||
      stop_position - payload_position != static_cast<int64_t>(size))
    return false;

  return true;
}